

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_switch(CTcParser *this,int *err)

{
  bool bVar1;
  bool bVar2;
  tc_toktyp_t tVar3;
  int iVar4;
  CTcTokenizer *this_00;
  CTcPrsNode *expr_00;
  CTPNStmEnclosing *stm;
  CTPNStmComp *body;
  int *in_RSI;
  CTcTokenizer *in_RDI;
  int in_stack_00000014;
  CTPNStmSwitch *in_stack_00000018;
  undefined4 in_stack_00000020;
  int in_stack_00000024;
  CTPNStmEnclosing *old_enclosing;
  int unreachable_error_shown;
  int skip;
  CTPNStm *body_stm;
  CTPNStmSwitch *switch_stm;
  CTcPrsNode *expr;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  CTcTokenizer *this_01;
  
  this_00 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x269112);
  CTPNStmSwitch::CTPNStmSwitch
            ((CTPNStmSwitch *)in_RDI,
             (CTPNStmEnclosing *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_01 = this_00;
  tVar3 = CTcTokenizer::next(this_00);
  if (tVar3 == TOKT_LPAR) {
    CTcTokenizer::next(this_01);
  }
  else {
    CTcTokenizer::log_error_curtok(in_RDI,in_stack_ffffffffffffff9c);
  }
  expr_00 = parse_expr((CTcParser *)0x26919f);
  if (expr_00 == (CTcPrsNode *)0x0) {
    *in_RSI = 1;
  }
  else {
    CTPNStmSwitchBase::set_expr((CTPNStmSwitchBase *)this_00,expr_00);
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2691e3);
    if (tVar3 == TOKT_RPAR) {
      CTcTokenizer::next(this_01);
    }
    else {
      CTcTokenizer::log_error_curtok(in_RDI,in_stack_ffffffffffffff9c);
    }
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x26921c);
    if (tVar3 == TOKT_LBRACE) {
      CTcTokenizer::next(this_01);
    }
    else {
      CTcTokenizer::log_error_curtok(in_RDI,in_stack_ffffffffffffff9c);
    }
    bVar1 = true;
    bVar2 = false;
    do {
      while( true ) {
        if (!bVar1) {
          stm = set_enclosing_stm((CTcParser *)in_RDI,(CTPNStmEnclosing *)this_00);
          body = parse_compound((CTcParser *)switch_stm,(int *)body_stm,skip,unreachable_error_shown
                                ,(CTPNStmSwitch *)old_enclosing,in_stack_00000024);
          set_enclosing_stm((CTcParser *)in_RDI,stm);
          if (*in_RSI == 0) {
            CTPNStmSwitchBase::set_body((CTPNStmSwitchBase *)this_00,(CTPNStm *)body);
            return (CTPNStm *)this_00;
          }
          return (CTPNStm *)0x0;
        }
        tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x269270);
        if (tVar3 == TOKT_EOF) {
          CTcTokenizer::log_error(0x2b49);
          *in_RSI = 1;
          return (CTPNStm *)0x0;
        }
        if ((tVar3 != TOKT_RBRACE) && (tVar3 != TOKT_CASE && tVar3 != TOKT_DEFAULT)) break;
        bVar1 = false;
      }
      if ((!bVar2) && (iVar4 = get_syntax_only(G_prs), iVar4 == 0)) {
        CTcTokenizer::log_error(0x2b48);
        bVar2 = true;
      }
      parse_stm((CTcParser *)old_enclosing,(int *)CONCAT44(in_stack_00000024,in_stack_00000020),
                in_stack_00000018,in_stack_00000014);
    } while (*in_RSI == 0);
  }
  return (CTPNStm *)0x0;
}

Assistant:

CTPNStm *CTcParser::parse_switch(int *err)
{
    CTcPrsNode *expr;
    CTPNStmSwitch *switch_stm;
    CTPNStm *body_stm;
    int skip;
    int unreachable_error_shown;
    CTPNStmEnclosing *old_enclosing;
    
    /* create the switch statement object */
    switch_stm = new CTPNStmSwitch(enclosing_stm_);

    /* skip the 'switch' and check for the left paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the left paren */
        G_tok->next();
    }
    else
    {
        /* log an error, and assume the paren is simply missing */
        G_tok->log_error_curtok(TCERR_REQ_SWITCH_LPAR);
    }

    /* parse the controlling expression */
    expr = parse_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* set expression in the switch statement node */
    switch_stm->set_expr(expr);

    /* check for and skip the close paren */
    if (G_tok->cur() == TOKT_RPAR)
    {
        /* the right paren is present - skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and keep going from here */
        G_tok->log_error_curtok(TCERR_REQ_SWITCH_RPAR);
    }

    /* check for and skip the brace */
    if (G_tok->cur() == TOKT_LBRACE)
    {
        /* it's there - skip it */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and keep going on the assumption that the brace
         *   is simply missing but the switch body is otherwise correct 
         */
        G_tok->log_error_curtok(TCERR_REQ_SWITCH_LBRACE);
    }

    /* 
     *   The first thing in the switch body must be a 'case', 'default',
     *   or closing brace.  Other statements preceding the first 'case' or
     *   'default' label within the switch body are not allowed, because
     *   they would be unreachable.  Keep skipping statements until we get
     *   to one of these.  
     */
    for (skip = TRUE, unreachable_error_shown = FALSE ; skip ; )
    {
        /* see what we have */
        switch(G_tok->cur())
        {
        case TOKT_CASE:
        case TOKT_DEFAULT:
        case TOKT_RBRACE:
            /* this is what we're looking for */
            skip = FALSE;
            break;

        case TOKT_EOF:
            /* end of file within the switch - log an error */
            G_tok->log_error(TCERR_EOF_IN_SWITCH);

            /* return failure */
            *err = TRUE;
            return 0;

        default:
            /* 
             *   for anything else, log an error explaining that the code
             *   is unreachable - do this only once, no matter how many
             *   unreachable statements precede the first case label 
             */
            if (!unreachable_error_shown && !G_prs->get_syntax_only())
            {
                /* show the error */
                G_tok->log_error(TCERR_UNREACHABLE_CODE_IN_SWITCH);
                
                /* 
                 *   note that we've shown the error, so we don't show it
                 *   again if more unreachable statements follow
                 */
                unreachable_error_shown = TRUE;
            }

            /* parse (and ignore) this statement */
            parse_stm(err, switch_stm, FALSE);
            if (*err != 0)
                return 0;

            /* keep looking for the first label */
            break;
        }
    }

    /* the 'switch' is the enclosing statement for children */
    old_enclosing = set_enclosing_stm(switch_stm);

    /* parse the switch body */
    body_stm = parse_compound(err, FALSE, TRUE, switch_stm, FALSE);

    /* restore the enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if we failed to parse the compound statement, give up */
    if (*err)
        return 0;

    /* connect the switch to its body */
    switch_stm->set_body(body_stm);

    /* return the switch statement node */
    return switch_stm;
}